

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O0

void __thiscall
DIS::ArealObjectStatePdu::unmarshal(ArealObjectStatePdu *this,DataStream *dataStream)

{
  undefined1 local_40 [8];
  Vector3Double x;
  size_t idx;
  DataStream *dataStream_local;
  ArealObjectStatePdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_modifications);
  EntityType::unmarshal(&this->_objectType,dataStream);
  SixByteChunk::unmarshal(&this->_objectAppearance,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfPoints);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::clear
            (&this->_objectLocation);
  for (x._z = 0.0; (ulong)x._z < (ulong)this->_numberOfPoints; x._z = (double)((long)x._z + 1)) {
    Vector3Double::Vector3Double((Vector3Double *)local_40);
    Vector3Double::unmarshal((Vector3Double *)local_40,dataStream);
    std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::push_back
              (&this->_objectLocation,(value_type *)local_40);
    Vector3Double::~Vector3Double((Vector3Double *)local_40);
  }
  return;
}

Assistant:

void ArealObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _modifications;
    _objectType.unmarshal(dataStream);
    _objectAppearance.unmarshal(dataStream);
    dataStream >> _numberOfPoints;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);

     _objectLocation.clear();
     for(size_t idx = 0; idx < _numberOfPoints; idx++)
     {
        Vector3Double x;
        x.unmarshal(dataStream);
        _objectLocation.push_back(x);
     }
}